

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

int resampler_input_delay(resampler *r)

{
  byte bVar1;
  resampler *r_local;
  
  bVar1 = r->quality;
  if (3 < bVar1) {
    if (bVar1 == 4) {
      return 1;
    }
    if (bVar1 == 5) {
      return 0xf;
    }
  }
  return 0;
}

Assistant:

static int resampler_input_delay(resampler *r)
{
    switch (r->quality)
    {
    default:
    case RESAMPLER_QUALITY_ZOH:
    case RESAMPLER_QUALITY_BLEP:
    case RESAMPLER_QUALITY_LINEAR:
    case RESAMPLER_QUALITY_BLAM:
        return 0;
            
    case RESAMPLER_QUALITY_CUBIC:
        return 1;
            
    case RESAMPLER_QUALITY_SINC:
        return SINC_WIDTH - 1;
    }
}